

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiTableColumnFlags TableFixColumnFlags(ImGuiTable *table,ImGuiTableColumnFlags flags)

{
  uint uVar1;
  uint uVar2;
  
  if ((flags & 0x1cU) == 0) {
    if (((uint)table->Flags >> 0xd & 1) == 0) {
      flags = flags | 8;
    }
    else {
      uVar1 = 4;
      if ((table->Flags & 1U) == 0) {
        uVar1 = 0x10;
      }
      if ((flags & 0x20U) != 0) {
        uVar1 = 0x10;
      }
      flags = flags | uVar1;
    }
  }
  uVar1 = (flags & 0x1cU) - 1;
  if (uVar1 < (flags & 0x1cU ^ uVar1)) {
    uVar2 = flags * 2 & 0x20U | flags;
    uVar1 = uVar2 | 0x80;
    if ((~flags & 0x300U) != 0) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  __assert_fail("ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                ,0x2117,
                "ImGuiTableColumnFlags TableFixColumnFlags(ImGuiTable *, ImGuiTableColumnFlags)");
}

Assistant:

static ImGuiTableColumnFlags TableFixColumnFlags(ImGuiTable* table, ImGuiTableColumnFlags flags)
{
    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        // FIXME-TABLE: Inconsistent to promote columns to WidthAlwaysAutoResize
        if (table->Flags & ImGuiTableFlags_SizingPolicyFixedX)
            flags |= ((table->Flags & ImGuiTableFlags_Resizable) && !(flags & ImGuiTableColumnFlags_NoResize)) ? ImGuiTableColumnFlags_WidthFixed : ImGuiTableColumnFlags_WidthAlwaysAutoResize;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    if ((flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize))// || ((flags & ImGuiTableColumnFlags_WidthStretch) && (table->Flags & ImGuiTableFlags_SizingPolicyStretchX)))
        flags |= ImGuiTableColumnFlags_NoResize;
    //if ((flags & ImGuiTableColumnFlags_WidthStretch) && (table->Flags & ImGuiTableFlags_SizingPolicyFixedX))
    //    flags = (flags & ~ImGuiTableColumnFlags_WidthMask_) | ImGuiTableColumnFlags_WidthFixed;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    return flags;
}